

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::DtlsSession::GetStateString_abi_cxx11_
          (string *__return_storage_ptr__,DtlsSession *this)

{
  allocator local_1a;
  undefined1 local_19;
  DtlsSession *local_18;
  DtlsSession *this_local;
  string *stateString;
  
  local_19 = 0;
  local_18 = this;
  this_local = (DtlsSession *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  switch(this->mState) {
  case kOpen:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"OPEN");
    break;
  case kConnecting:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"CONNECTING");
    break;
  case kConnected:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"CONNECTED");
    break;
  case kDisconnected:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DISCONNECTED");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DtlsSession::GetStateString() const
{
    std::string stateString = "UNKNOWN";
    switch (mState)
    {
    case State::kOpen:
        stateString = "OPEN";
        break;
    case State::kConnecting:
        stateString = "CONNECTING";
        break;
    case State::kConnected:
        stateString = "CONNECTED";
        break;
    case State::kDisconnected:
        stateString = "DISCONNECTED";
        break;
    }
    return stateString;
}